

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O1

int kex_agree_crypt(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *crypt,
                   size_t crypt_len)

{
  LIBSSH2_CRYPT_METHOD *pLVar1;
  LIBSSH2_CRYPT_METHOD **methodlist;
  char *pcVar2;
  uchar *puVar3;
  LIBSSH2_COMMON_METHOD *pLVar4;
  size_t sVar5;
  _func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *needle;
  int unaff_R15D;
  
  methodlist = libssh2_crypt_methods();
  needle = session->addLocalIdentities;
  if (needle == (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)0x0) {
    unaff_R15D = -1;
    pLVar1 = *methodlist;
    while (pLVar1 != (LIBSSH2_CRYPT_METHOD *)0x0) {
      methodlist = methodlist + 1;
      puVar3 = (uchar *)pLVar1->name;
      if (puVar3 == (uchar *)0x0) {
        return -1;
      }
      sVar5 = strlen((char *)puVar3);
      puVar3 = _libssh2_kex_agree_instr((uchar *)endpoint,(size_t)crypt,puVar3,sVar5);
      if (puVar3 != (uchar *)0x0) {
        session->free = (_func_void_void_ptr_void_ptr_ptr *)pLVar1;
        return 0;
      }
      pLVar1 = *methodlist;
    }
  }
  else {
    do {
      if (needle == (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)0x0) {
        return -1;
      }
      if (*needle == (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr)0x0) {
        return -1;
      }
      pcVar2 = strchr((char *)needle,0x2c);
      if (pcVar2 == (char *)0x0) {
        sVar5 = strlen((char *)needle);
      }
      else {
        sVar5 = (long)pcVar2 - (long)needle;
      }
      puVar3 = _libssh2_kex_agree_instr((uchar *)endpoint,(size_t)crypt,(uchar *)needle,sVar5);
      if (puVar3 == (uchar *)0x0) {
        needle = (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)(pcVar2 + 1);
        if (pcVar2 == (char *)0x0) {
          needle = (_func_void_LIBSSH2_SESSION_ptr_void_ptr_char_ptr_void_ptr_ptr *)0x0;
        }
      }
      else {
        pLVar4 = kex_get_method_by_name((char *)needle,sVar5,(LIBSSH2_COMMON_METHOD **)methodlist);
        if (pLVar4 == (LIBSSH2_COMMON_METHOD *)0x0) {
          unaff_R15D = -1;
        }
        else {
          session->free = (_func_void_void_ptr_void_ptr_ptr *)pLVar4;
          unaff_R15D = 0;
        }
      }
    } while (puVar3 == (uchar *)0x0);
  }
  return unaff_R15D;
}

Assistant:

static int kex_agree_crypt(LIBSSH2_SESSION * session,
                           libssh2_endpoint_data *endpoint,
                           unsigned char *crypt,
                           size_t crypt_len)
{
    const LIBSSH2_CRYPT_METHOD **cryptp = libssh2_crypt_methods();
    unsigned char *s;

    (void)session;

    if(endpoint->crypt_prefs) {
        s = (unsigned char *) endpoint->crypt_prefs;

        while(s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if(_libssh2_kex_agree_instr(crypt, crypt_len, s, method_len)) {
                const LIBSSH2_CRYPT_METHOD *method =
                    (const LIBSSH2_CRYPT_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           cryptp);

                if(!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->crypt = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while(*cryptp && (*cryptp)->name) {
        s = _libssh2_kex_agree_instr(crypt, crypt_len,
                                     (unsigned char *) (*cryptp)->name,
                                     strlen((*cryptp)->name));
        if(s) {
            endpoint->crypt = *cryptp;
            return 0;
        }
        cryptp++;
    }

    return -1;
}